

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.c
# Opt level: O0

int lws_handle_POLLOUT_event(lws *wsi,pollfd *pollfd)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int eff;
  int n;
  lws *vwsi;
  pollfd *pollfd_local;
  lws *wsi_local;
  
  wsi->leave_pollout_active = '\0';
  wsi->handling_pollout = '\x01';
  *(ulong *)&wsi->field_0x2dc = *(ulong *)&wsi->field_0x2dc & 0xfffffbffffffffff;
  iVar2 = lws_has_buffered_out(wsi);
  if (iVar2 == 0) {
    if ((wsi->wsistate & 0xffff) == 0x11e) {
      *(ulong *)&wsi->field_0x2dc = *(ulong *)&wsi->field_0x2dc & 0xffffffffffffefff | 0x1000;
    }
    else {
      if (wsi->role_ops == (lws_role_ops *)0x0) {
        __assert_fail("wsi->role_ops",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/core-net/service.c"
                      ,0x90,"int lws_handle_POLLOUT_event(struct lws *, struct pollfd *)");
      }
      if ((wsi->role_ops->handle_POLLOUT == (_func_int_lws_ptr *)0x0) ||
         (iVar2 = (*wsi->role_ops->handle_POLLOUT)(wsi), iVar2 == 0)) goto LAB_0011b0c4;
      if (iVar2 != 1) {
        if (1 < iVar2 - 2U) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/core-net/service.c"
                        ,0x9f,"int lws_handle_POLLOUT_event(struct lws *, struct pollfd *)");
        }
        if (pollfd != (pollfd *)0x0) {
          cVar1 = wsi->leave_pollout_active;
          if ((cVar1 == '\0') && (iVar3 = lws_change_pollfd(wsi,4,0), iVar3 != 0)) {
            _lws_log(8,"failed at set pollfd\n");
            goto LAB_0011b0e3;
          }
          wsi->handling_pollout = '\0';
          if ((cVar1 == '\0') && (wsi->leave_pollout_active != '\0')) {
            _lws_log(0x10,"leave_pollout_active\n");
            iVar3 = lws_change_pollfd(wsi,0,4);
            if (iVar3 != 0) {
              _lws_log(8,"failed at set pollfd\n");
              goto LAB_0011b0e3;
            }
          }
          wsi->leave_pollout_active = '\0';
        }
        if ((((((wsi->wsistate & 0x10000000) != 0) && ((*(ulong *)&wsi->field_0x2dc & 1) == 0)) &&
             ((wsi->wsistate & 0xffff) != 0x10f)) && ((wsi->wsistate & 0xffff) != 0x14)) ||
           (iVar2 == 3)) {
LAB_0011b0c4:
          wsi->handling_pollout = '\0';
          wsi->leave_pollout_active = '\0';
          return 0;
        }
        if (wsi->role_ops->perform_user_POLLOUT == (_func_int_lws_ptr *)0x0) {
          _lws_log(0x10,"%s: %p: non mux: wsistate 0x%lx, ops %s\n","lws_handle_POLLOUT_event",wsi,
                   (ulong)wsi->wsistate,wsi->role_ops->name);
          wsi->leave_pollout_active = '\0';
          iVar2 = lws_callback_as_writeable(wsi);
          wsi->handling_pollout = '\0';
          if (wsi->leave_pollout_active == '\0') {
            return iVar2;
          }
          iVar3 = lws_change_pollfd(wsi,0,4);
          if (iVar3 == 0) {
            return iVar2;
          }
        }
        else {
          iVar2 = (*wsi->role_ops->perform_user_POLLOUT)(wsi);
          if (iVar2 != -1) goto LAB_0011b0c4;
        }
      }
    }
  }
  else {
    iVar2 = lws_issue_raw(wsi,(uchar *)0x0,0);
    if (-1 < iVar2) goto LAB_0011b0c4;
    _lws_log(8,"%s signalling to close\n","lws_handle_POLLOUT_event");
  }
LAB_0011b0e3:
  wsi->handling_pollout = '\0';
  wsi->leave_pollout_active = '\0';
  return -1;
}

Assistant:

int
lws_handle_POLLOUT_event(struct lws *wsi, struct lws_pollfd *pollfd)
{
	volatile struct lws *vwsi = (volatile struct lws *)wsi;
	int n;

	// lwsl_notice("%s: %p\n", __func__, wsi);

	vwsi->leave_pollout_active = 0;
	vwsi->handling_pollout = 1;
	/*
	 * if another thread wants POLLOUT on us, from here on while
	 * handling_pollout is set, he will only set leave_pollout_active.
	 * If we are going to disable POLLOUT, we will check that first.
	 */
	wsi->could_have_pending = 0; /* clear back-to-back write detection */

	/*
	 * user callback is lowest priority to get these notifications
	 * actually, since other pending things cannot be disordered
	 *
	 * Priority 1: pending truncated sends are incomplete ws fragments
	 *	       If anything else sent first the protocol would be
	 *	       corrupted.
	 *
	 *	       These are post- any compression transform
	 */

	if (lws_has_buffered_out(wsi)) {
		//lwsl_notice("%s: completing partial\n", __func__);
		if (lws_issue_raw(wsi, NULL, 0) < 0) {
			lwsl_info("%s signalling to close\n", __func__);
			goto bail_die;
		}
		/* leave POLLOUT active either way */
		goto bail_ok;
	} else
		if (lwsi_state(wsi) == LRS_FLUSHING_BEFORE_CLOSE) {
			wsi->socket_is_permanently_unusable = 1;
			goto bail_die; /* retry closing now */
		}

	/* Priority 2: pre- compression transform */

#if defined(LWS_WITH_HTTP_STREAM_COMPRESSION)
	if (wsi->http.comp_ctx.buflist_comp ||
	    wsi->http.comp_ctx.may_have_more) {
		enum lws_write_protocol wp = LWS_WRITE_HTTP;

		lwsl_info("%s: completing comp partial (buflist_comp %p, may %d)\n",
				__func__, wsi->http.comp_ctx.buflist_comp,
				wsi->http.comp_ctx.may_have_more
				);

		if (wsi->role_ops->write_role_protocol(wsi, NULL, 0, &wp) < 0) {
			lwsl_info("%s signalling to close\n", __func__);
			goto bail_die;
		}
		lws_callback_on_writable(wsi);

		goto bail_ok;
	}
#endif

#ifdef LWS_WITH_CGI
	/*
	 * A cgi master's wire protocol remains h1 or h2.  He is just getting
	 * his data from his child cgis.
	 */
	if (wsi->http.cgi) {
		/* also one shot */
		if (pollfd)
			if (lws_change_pollfd(wsi, LWS_POLLOUT, 0)) {
				lwsl_info("failed at set pollfd\n");
				return 1;
			}
		goto user_service_go_again;
	}
#endif

	/* if we got here, we should have wire protocol ops set on the wsi */
	assert(wsi->role_ops);

	if (!wsi->role_ops->handle_POLLOUT)
		goto bail_ok;

	n = wsi->role_ops->handle_POLLOUT(wsi);
	switch (n) {
	case LWS_HP_RET_BAIL_OK:
		goto bail_ok;
	case LWS_HP_RET_BAIL_DIE:
		goto bail_die;
	case LWS_HP_RET_DROP_POLLOUT:
	case LWS_HP_RET_USER_SERVICE:
		break;
	default:
		assert(0);
	}

	/* one shot */

	if (pollfd) {
		int eff = vwsi->leave_pollout_active;

		if (!eff) {
			if (lws_change_pollfd(wsi, LWS_POLLOUT, 0)) {
				lwsl_info("failed at set pollfd\n");
				goto bail_die;
			}
		}

		vwsi->handling_pollout = 0;

		/* cannot get leave_pollout_active set after the above */
		if (!eff && wsi->leave_pollout_active) {
			/*
			 * got set inbetween sampling eff and clearing
			 * handling_pollout, force POLLOUT on
			 */
			lwsl_debug("leave_pollout_active\n");
			if (lws_change_pollfd(wsi, 0, LWS_POLLOUT)) {
				lwsl_info("failed at set pollfd\n");
				goto bail_die;
			}
		}

		vwsi->leave_pollout_active = 0;
	}

	if (lwsi_role_client(wsi) && !wsi->hdr_parsing_completed &&
	     lwsi_state(wsi) != LRS_H2_WAITING_TO_SEND_HEADERS &&
	     lwsi_state(wsi) != LRS_ISSUE_HTTP_BODY)
		goto bail_ok;

	if (n == LWS_HP_RET_DROP_POLLOUT)
		goto bail_ok;


#ifdef LWS_WITH_CGI
user_service_go_again:
#endif

	if (wsi->role_ops->perform_user_POLLOUT) {
		if (wsi->role_ops->perform_user_POLLOUT(wsi) == -1)
			goto bail_die;
		else
			goto bail_ok;
	}

	lwsl_debug("%s: %p: non mux: wsistate 0x%lx, ops %s\n", __func__, wsi,
		   (unsigned long)wsi->wsistate, wsi->role_ops->name);

	vwsi = (volatile struct lws *)wsi;
	vwsi->leave_pollout_active = 0;

	n = lws_callback_as_writeable(wsi);
	vwsi->handling_pollout = 0;

	if (vwsi->leave_pollout_active)
		if (lws_change_pollfd(wsi, 0, LWS_POLLOUT))
			goto bail_die;

	return n;

	/*
	 * since these don't disable the POLLOUT, they are always doing the
	 * right thing for leave_pollout_active whether it was set or not.
	 */

bail_ok:
	vwsi->handling_pollout = 0;
	vwsi->leave_pollout_active = 0;

	return 0;

bail_die:
	vwsi->handling_pollout = 0;
	vwsi->leave_pollout_active = 0;

	return -1;
}